

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void __thiscall
phmap::priv::
base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
::clear(base_checker<phmap::btree_map<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
        *this)

{
  btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  ::clear((btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           *)this);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&(this->checker_)._M_t);
  return;
}

Assistant:

void clear() {
        tree_.clear();
        checker_.clear();
    }